

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcDerivedProfileDef::~IfcDerivedProfileDef
          (IfcDerivedProfileDef *this,void **vtt)

{
  void **vtt_local;
  IfcDerivedProfileDef *this_local;
  
  (this->super_IfcProfileDef).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
  _vptr_ObjectHelper = (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcProfileDef).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                    _vptr_ObjectHelper +
            (long)(this->super_IfcProfileDef).
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper
                  [-3]) = vtt[7];
  *(void **)&(this->super_IfcProfileDef).field_0x58 = vtt[8];
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Maybe(&this->Label);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcDerivedProfileDef,_3UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcDerivedProfileDef,_3UL> *)
             &(this->super_IfcProfileDef).field_0x58,vtt + 5);
  IfcProfileDef::~IfcProfileDef(&this->super_IfcProfileDef,vtt + 1);
  return;
}

Assistant:

IfcDerivedProfileDef() : Object("IfcDerivedProfileDef") {}